

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlReaderNewMemory(xmlTextReaderPtr reader,char *buffer,int size,char *URL,char *encoding,
                      int options)

{
  xmlParserInputBufferPtr input_00;
  xmlParserInputBufferPtr input;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int size_local;
  char *buffer_local;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (buffer == (char *)0x0) {
    reader_local._4_4_ = -1;
  }
  else {
    input_00 = xmlParserInputBufferCreateMem(buffer,size,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      reader_local._4_4_ = -1;
    }
    else {
      reader_local._4_4_ = xmlTextReaderSetup(reader,input_00,URL,encoding,options);
    }
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlReaderNewMemory(xmlTextReaderPtr reader, const char *buffer, int size,
                   const char *URL, const char *encoding, int options)
{
    xmlParserInputBufferPtr input;

    if (reader == NULL)
        return (-1);
    if (buffer == NULL)
        return (-1);

    input = xmlParserInputBufferCreateMem(buffer, size,
                                      XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
        return (-1);
    }
    return (xmlTextReaderSetup(reader, input, URL, encoding, options));
}